

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

Flag<TestConfig> *
anon_unknown.dwarf_421bc::CredentialFlagWithDefault
          (Flag<TestConfig> *__return_storage_ptr__,Flag<TestConfig> *default_flag,
          Flag<CredentialConfig> *flag)

{
  int iVar1;
  anon_class_96_2_66fa7266 local_80;
  Flag<CredentialConfig> *local_20;
  Flag<CredentialConfig> *flag_local;
  Flag<TestConfig> *default_flag_local;
  
  local_20 = flag;
  flag_local = (Flag<CredentialConfig> *)default_flag;
  default_flag_local = __return_storage_ptr__;
  iVar1 = strcmp(default_flag->name,flag->name);
  if (iVar1 != 0) {
    abort();
  }
  if ((default_flag->has_param & 1U) != (flag->has_param & 1U)) {
    abort();
  }
  __return_storage_ptr__->name = flag->name;
  __return_storage_ptr__->has_param = (bool)(flag->has_param & 1);
  __return_storage_ptr__->skip_handshaker = false;
  Flag<TestConfig>::Flag(&local_80.default_flag,default_flag);
  Flag<CredentialConfig>::Flag(&local_80.flag,flag);
  std::function<bool(TestConfig*,char_const*)>::
  function<(anonymous_namespace)::CredentialFlagWithDefault((anonymous_namespace)::Flag<TestConfig>,(anonymous_namespace)::Flag<CredentialConfig>)::__0,void>
            ((function<bool(TestConfig*,char_const*)> *)&__return_storage_ptr__->set_param,&local_80
            );
  (anonymous_namespace)::
  CredentialFlagWithDefault((anonymous_namespace)::Flag<TestConfig>,(anonymous_namespace)::Flag<CredentialConfig>)
  ::$_0::~__0((__0 *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

Flag<TestConfig> CredentialFlagWithDefault(Flag<TestConfig> default_flag,
                                           Flag<CredentialConfig> flag) {
  BSSL_CHECK(strcmp(default_flag.name, flag.name) == 0);
  BSSL_CHECK(default_flag.has_param == flag.has_param);
  return Flag<TestConfig>{flag.name, flag.has_param, /*skip_handshaker=*/false,
                          [=](TestConfig *config, const char *param) -> bool {
                            if (config->credentials.empty()) {
                              return default_flag.set_param(config, param);
                            }
                            return flag.set_param(&config->credentials.back(),
                                                  param);
                          }};
}